

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsBoolean.c
# Opt level: O0

void JsBooleanConstConstruct(JsObject *self,JsObject *thisobj,int argc,JsValue **argv,JsValue *res)

{
  JsObject *local_68;
  JsObject *boolean;
  JsValue v0;
  JsValue v;
  JsValue *res_local;
  JsValue **argv_local;
  int argc_local;
  JsObject *thisobj_local;
  JsObject *self_local;
  
  (*self->Get)(self,"prototype",(int *)0x0,(JsValue *)((long)&v0.u + 8));
  if (argc < 1) {
    local_68 = JsCreateBooleanObject((JsObject *)v._0_8_,0);
  }
  else {
    JsToBoolean(*argv,(JsValue *)&boolean);
    local_68 = JsCreateBooleanObject((JsObject *)v._0_8_,v0.type);
  }
  res->type = JS_OBJECT;
  (res->u).object = local_68;
  return;
}

Assistant:

static	void JsBooleanConstConstruct(struct JsObject *self, struct JsObject *thisobj, int argc, struct JsValue **argv, struct JsValue *res){
	struct JsValue v;
	struct JsValue v0;
	(*self->Get)(self,"prototype",NULL,&v);
	struct JsObject*  boolean;
	if(argc<=0){
		boolean = JsCreateBooleanObject(v.u.object,FALSE);
	}else{
		JsToBoolean(argv[0],&v0);
		boolean = JsCreateBooleanObject(v.u.object,v0.u.boolean);
	}
	res->type = JS_OBJECT;
	res->u.object = boolean;
}